

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txfm_common_avx2.h
# Opt level: O0

void transpose_16bit_16x8_avx2(__m256i *in,__m256i *out)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 (*in_RSI) [32];
  undefined1 (*in_RDI) [32];
  __m256i b7;
  __m256i b6;
  __m256i b5;
  __m256i b4;
  __m256i b3;
  __m256i b2;
  __m256i b1;
  __m256i b0;
  __m256i a7;
  __m256i a6;
  __m256i a5;
  __m256i a4;
  __m256i a3;
  __m256i a2;
  __m256i a1;
  __m256i a0;
  
  auVar5 = vpunpcklwd_avx2(*in_RDI,in_RDI[1]);
  auVar6 = vpunpcklwd_avx2(in_RDI[2],in_RDI[3]);
  auVar7 = vpunpcklwd_avx2(in_RDI[4],in_RDI[5]);
  auVar8 = vpunpcklwd_avx2(in_RDI[6],in_RDI[7]);
  auVar1 = vpunpckhwd_avx2(*in_RDI,in_RDI[1]);
  auVar2 = vpunpckhwd_avx2(in_RDI[2],in_RDI[3]);
  auVar3 = vpunpckhwd_avx2(in_RDI[4],in_RDI[5]);
  auVar4 = vpunpckhwd_avx2(in_RDI[6],in_RDI[7]);
  auVar9 = vpunpckldq_avx2(auVar5,auVar6);
  auVar10 = vpunpckldq_avx2(auVar7,auVar8);
  auVar11 = vpunpckldq_avx2(auVar1,auVar2);
  auVar12 = vpunpckldq_avx2(auVar3,auVar4);
  auVar5 = vpunpckhdq_avx2(auVar5,auVar6);
  auVar6 = vpunpckhdq_avx2(auVar7,auVar8);
  auVar1 = vpunpckhdq_avx2(auVar1,auVar2);
  auVar2 = vpunpckhdq_avx2(auVar3,auVar4);
  auVar3 = vpunpcklqdq_avx2(auVar9,auVar10);
  *in_RSI = auVar3;
  auVar3 = vpunpckhqdq_avx2(auVar9,auVar10);
  in_RSI[1] = auVar3;
  auVar3 = vpunpcklqdq_avx2(auVar5,auVar6);
  in_RSI[2] = auVar3;
  auVar3 = vpunpckhqdq_avx2(auVar5,auVar6);
  in_RSI[3] = auVar3;
  auVar3 = vpunpcklqdq_avx2(auVar11,auVar12);
  in_RSI[4] = auVar3;
  auVar3 = vpunpckhqdq_avx2(auVar11,auVar12);
  in_RSI[5] = auVar3;
  auVar3 = vpunpcklqdq_avx2(auVar1,auVar2);
  in_RSI[6] = auVar3;
  auVar1 = vpunpckhqdq_avx2(auVar1,auVar2);
  in_RSI[7] = auVar1;
  return;
}

Assistant:

static inline void transpose_16bit_16x8_avx2(const __m256i *const in,
                                             __m256i *const out) {
  const __m256i a0 = _mm256_unpacklo_epi16(in[0], in[1]);
  const __m256i a1 = _mm256_unpacklo_epi16(in[2], in[3]);
  const __m256i a2 = _mm256_unpacklo_epi16(in[4], in[5]);
  const __m256i a3 = _mm256_unpacklo_epi16(in[6], in[7]);
  const __m256i a4 = _mm256_unpackhi_epi16(in[0], in[1]);
  const __m256i a5 = _mm256_unpackhi_epi16(in[2], in[3]);
  const __m256i a6 = _mm256_unpackhi_epi16(in[4], in[5]);
  const __m256i a7 = _mm256_unpackhi_epi16(in[6], in[7]);

  const __m256i b0 = _mm256_unpacklo_epi32(a0, a1);
  const __m256i b1 = _mm256_unpacklo_epi32(a2, a3);
  const __m256i b2 = _mm256_unpacklo_epi32(a4, a5);
  const __m256i b3 = _mm256_unpacklo_epi32(a6, a7);
  const __m256i b4 = _mm256_unpackhi_epi32(a0, a1);
  const __m256i b5 = _mm256_unpackhi_epi32(a2, a3);
  const __m256i b6 = _mm256_unpackhi_epi32(a4, a5);
  const __m256i b7 = _mm256_unpackhi_epi32(a6, a7);

  out[0] = _mm256_unpacklo_epi64(b0, b1);
  out[1] = _mm256_unpackhi_epi64(b0, b1);
  out[2] = _mm256_unpacklo_epi64(b4, b5);
  out[3] = _mm256_unpackhi_epi64(b4, b5);
  out[4] = _mm256_unpacklo_epi64(b2, b3);
  out[5] = _mm256_unpackhi_epi64(b2, b3);
  out[6] = _mm256_unpacklo_epi64(b6, b7);
  out[7] = _mm256_unpackhi_epi64(b6, b7);
}